

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeConcepts.hh
# Opt level: O2

shared_ptr<avro::Node> * __thiscall
avro::concepts::SingleAttribute<boost::shared_ptr<avro::Node>_>::get
          (SingleAttribute<boost::shared_ptr<avro::Node>_> *this,size_t index)

{
  Exception *this_00;
  allocator<char> local_39;
  string local_38;
  
  if (index == 0) {
    return &this->attr_;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x18);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"SingleAttribute has only 1 value",&local_39);
  Exception::Exception(this_00,&local_38);
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

const Attribute &get(size_t index = 0) const {
        if (index != 0) {
            throw Exception("SingleAttribute has only 1 value");
        }
        return attr_;
    }